

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

Cord * __thiscall absl::lts_20250127::Cord::operator=(Cord *this,string_view src)

{
  RefcountAndFlags *pRVar1;
  byte bVar2;
  CordzUpdateScope CVar3;
  CordzInfo *in_RAX;
  CordzInfo *this_00;
  Nullable<CordRep_*> pCVar4;
  sbyte sVar5;
  sbyte sVar6;
  Nullable<const_char_*> data;
  size_t extraout_RDX;
  size_t alloc_hint;
  size_t extraout_RDX_00;
  uint uVar7;
  ulong length;
  CordRep *rep;
  long *in_FS_OFFSET;
  CordzUpdateScope scope;
  CordzUpdateScope local_28;
  
  data = src._M_str;
  length = src._M_len;
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    rep = (CordRep *)0x0;
  }
  else {
    rep = (this->contents_).data_.rep_.field_0.as_tree.rep;
  }
  if (length < 0x10) {
    if (rep == (CordRep *)0x0) {
      cord_internal::InlineData::set_inline_data((InlineData *)this,data,length);
      return this;
    }
    local_28.info_ = in_RAX;
    this_00 = cord_internal::InlineData::cordz_info((InlineData *)this);
    if (this_00 != (CordzInfo *)0x0) {
      cord_internal::CordzInfo::Untrack(this_00);
    }
    cord_internal::InlineData::set_inline_data((InlineData *)this,data,length);
    LOCK();
    pRVar1 = &rep->refcount;
    uVar7 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar7 & 1) != 0 || 0 < (int)uVar7) {
      if (uVar7 != 2) {
        return this;
      }
      cord_internal::CordRep::Destroy(rep);
      return this;
    }
  }
  else {
    if (rep == (CordRep *)0x0) {
      pCVar4 = NewTree(data,length,(size_t)data);
      if (pCVar4 == (Nullable<CordRep_*>)0x0) {
        __assert_fail("rep",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                      ,0x4e8,
                      "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                     );
      }
      (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar4;
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
      if (1 < in_FS_OFFSET[-0xb]) {
        in_FS_OFFSET[-0xb] = in_FS_OFFSET[-0xb] + -1;
        return this;
      }
      operator=((Cord *)(*in_FS_OFFSET + -0x58));
      return this;
    }
    local_28.info_ = cord_internal::InlineData::cordz_info((InlineData *)this);
    alloc_hint = extraout_RDX;
    if (local_28.info_ != (CordzInfo *)0x0) {
      cord_internal::CordzInfo::Lock(local_28.info_,kAssignString);
      alloc_hint = extraout_RDX_00;
    }
    bVar2 = rep->tag;
    if (5 < bVar2) {
      if (0xf8 < bVar2) {
LAB_0030c0cc:
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
      }
      sVar6 = 0xc;
      if (bVar2 < 0xbb) {
        sVar6 = 6;
      }
      uVar7 = 0xfff47ff3;
      if (bVar2 < 0xbb) {
        uVar7 = 0xfffff173;
      }
      sVar5 = 3;
      if (0x42 < bVar2) {
        sVar5 = sVar6;
      }
      alloc_hint = 0xffffffe3;
      if (0x42 < bVar2) {
        alloc_hint = (size_t)uVar7;
      }
      if ((length <= (ulong)(long)(int)(((uint)bVar2 << sVar5) + (int)alloc_hint)) &&
         ((rep->refcount).count_.super___atomic_base<int>._M_i == 2)) {
        if ((rep->tag - 0xf9 < 7) || (rep->tag < 6)) goto LAB_0030c0cc;
        memmove(rep->storage,data,length);
        rep->length = length;
        VerifyTree(rep);
        goto LAB_0030c01c;
      }
    }
    pCVar4 = NewTree(data,length,alloc_hint);
    CVar3.info_ = local_28.info_;
    if (pCVar4 == (Nullable<CordRep_*>)0x0) {
      __assert_fail("rep",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x4f6,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
      __assert_fail("data_.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x4f7,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar4;
    if (local_28.info_ != (CordzInfo *)0x0) {
      Mutex::AssertHeld(&(local_28.info_)->mutex_);
      (CVar3.info_)->rep_ = pCVar4;
    }
    LOCK();
    pRVar1 = &rep->refcount;
    uVar7 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar7 & 1) != 0 || 0 < (int)uVar7) {
      if (uVar7 == 2) {
        cord_internal::CordRep::Destroy(rep);
      }
LAB_0030c01c:
      cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_28);
      return this;
    }
  }
  __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0xac,"bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
}

Assistant:

Cord& Cord::operator=(absl::string_view src) {
  auto constexpr method = CordzUpdateTracker::kAssignString;
  const char* data = src.data();
  size_t length = src.size();
  CordRep* tree = contents_.tree();
  if (length <= InlineRep::kMaxInline) {
    // Embed into this->contents_, which is somewhat subtle:
    // - MaybeUntrackCord must be called before Unref(tree).
    // - MaybeUntrackCord must be called before set_data() clobbers cordz_info.
    // - set_data() must be called before Unref(tree) as it may reference tree.
    if (tree != nullptr) CordzInfo::MaybeUntrackCord(contents_.cordz_info());
    contents_.set_data(data, length);
    if (tree != nullptr) CordRep::Unref(tree);
    return *this;
  }
  if (tree != nullptr) {
    CordzUpdateScope scope(contents_.cordz_info(), method);
    if (tree->IsFlat() && tree->flat()->Capacity() >= length &&
        tree->refcount.IsOne()) {
      // Copy in place if the existing FLAT node is reusable.
      memmove(tree->flat()->Data(), data, length);
      tree->length = length;
      VerifyTree(tree);
      return *this;
    }
    contents_.SetTree(NewTree(data, length, 0), scope);
    CordRep::Unref(tree);
  } else {
    contents_.EmplaceTree(NewTree(data, length, 0), method);
  }
  return *this;
}